

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

void refs_resize(refs_table_t *tbl)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  uint64_t *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong *puVar10;
  long lVar11;
  long *plVar12;
  int iVar13;
  size_t sVar14;
  ulong *puVar15;
  bool bVar16;
  
  do {
    uVar1 = tbl->refs_control;
    if (uVar1 < 0x10000000) {
      bVar4 = false;
      LOCK();
      bVar16 = uVar1 == tbl->refs_control;
      if (bVar16) {
        tbl->refs_control = uVar1 | 0x80000000;
      }
      UNLOCK();
      if (bVar16) {
        do {
        } while( true );
      }
    }
    else {
      do {
        iVar13 = refs_resize_help(tbl);
      } while (iVar13 != 0);
      bVar4 = true;
    }
  } while (!bVar4);
  if (bVar4) {
    return;
  }
  tbl->refs_resize_table = tbl->refs_table;
  tbl->refs_resize_size = tbl->refs_size;
  LOCK();
  tbl->refs_resize_part = 0;
  UNLOCK();
  uVar7 = 0;
  LOCK();
  tbl->refs_resize_done = 0;
  UNLOCK();
  uVar2 = tbl->refs_size;
  if (uVar2 != 0) {
    lVar11 = 0;
    lVar6 = 0;
    do {
      lVar3 = *(long *)((long)tbl->refs_table + lVar11);
      if ((lVar3 != 0) && (lVar3 != 0x7fffffffffffffff)) {
        lVar6 = lVar6 + 1;
      }
      lVar11 = lVar11 + 8;
    } while (uVar2 * 8 - lVar11 != 0);
    uVar7 = lVar6 << 2;
  }
  sVar14 = uVar2 << (uVar2 < uVar7);
  plVar12 = (long *)0x0;
  puVar5 = (uint64_t *)mmap((void *)0x0,sVar14 * 8 + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
  if (1 < (long)puVar5 + 1U) {
    tbl->refs_table = puVar5;
    tbl->refs_size = sVar14;
    LOCK();
    tbl->refs_control = 0x40000000;
    UNLOCK();
    while (tbl->refs_resize_done != tbl->refs_resize_size >> 7) {
      refs_resize_help(tbl);
    }
    LOCK();
    tbl->refs_control = 0;
    UNLOCK();
    munmap(tbl->refs_resize_table,tbl->refs_resize_size * 8 + 0x3f & 0xffffffffffffffc0);
    return;
  }
  refs_resize_cold_1();
  if (((0xfffffff < *(uint *)(plVar12 + 2)) && (-1 < (int)plVar12[2])) &&
     ((ulong)plVar12[5] < (ulong)plVar12[4] >> 7)) {
    LOCK();
    puVar10 = (ulong *)(plVar12 + 5);
    uVar2 = *puVar10;
    *puVar10 = *puVar10 + 1;
    UNLOCK();
    if (uVar2 < (ulong)plVar12[4] >> 7) {
      puVar10 = (ulong *)(uVar2 * 0x400 + plVar12[3]);
      iVar13 = 0;
      do {
        uVar2 = *puVar10;
        if ((uVar2 != 0) && (uVar2 != 0x7fffffffffffffff)) {
          uVar7 = uVar2 & 0xffffffffff;
          uVar8 = ((uVar7 ^ 0xcbf29ce484222325) * 0x100000001b3 ^ (uVar7 >> 0x27 | uVar7 << 0x19)) *
                  0x100000001b3;
          lVar6 = *plVar12;
          uVar7 = plVar12[1];
          puVar15 = (ulong *)(lVar6 + ((uVar8 >> 0x20 ^ uVar8) % uVar7) * 8);
          iVar9 = -0x81;
          do {
            iVar9 = iVar9 + 1;
            if (iVar9 == 0) break;
            if (*puVar15 == 0) {
              bVar4 = false;
              LOCK();
              uVar8 = *puVar15;
              if (uVar8 == 0) {
                *puVar15 = uVar2;
              }
              UNLOCK();
              if (uVar8 != 0) goto LAB_0012c0ac;
            }
            else {
LAB_0012c0ac:
              puVar15 = puVar15 + 1;
              bVar4 = true;
              if (puVar15 == (ulong *)(lVar6 + uVar7 * 8)) {
                puVar15 = (ulong *)*plVar12;
              }
            }
          } while (bVar4);
        }
        puVar10 = puVar10 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar13 != 0x80);
      LOCK();
      plVar12[6] = plVar12[6] + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

static void
refs_resize(refs_table_t *tbl)
{
    while (1) {
        uint32_t v = tbl->refs_control;
        if (v & 0xf0000000) {
            // someone else started resize
            // just rehash blocks until done
            while (refs_resize_help(tbl)) continue;
            return;
        }
        if (atomic_compare_exchange_weak(&tbl->refs_control, &v, 0x80000000 | v)) {
            // wait until all users gone
            while (tbl->refs_control != 0x80000000) continue;
            break;
        }
    }

    tbl->refs_resize_table = tbl->refs_table;
    tbl->refs_resize_size = tbl->refs_size;
    tbl->refs_resize_part = 0;
    tbl->refs_resize_done = 0;

    // calculate new size
    size_t new_size = tbl->refs_size;
    size_t count = refs_count(tbl);
    if (count*4 > tbl->refs_size) new_size *= 2;

    // allocate new table
    _Atomic(uint64_t)* new_table = (_Atomic(uint64_t)*)alloc_aligned(new_size * sizeof(uint64_t));
    if (new_table == 0) {
        fprintf(stderr, "refs: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

    // set new data and go
    tbl->refs_table = new_table;
    tbl->refs_size = new_size;
    compiler_barrier();
    tbl->refs_control = 0x40000000;

    // until all parts are done, rehash blocks
    while (tbl->refs_resize_done != tbl->refs_resize_size/128) refs_resize_help(tbl);

    // done!
    compiler_barrier();
    tbl->refs_control = 0;

    // unmap old table
    free_aligned(tbl->refs_resize_table, tbl->refs_resize_size * sizeof(uint64_t));
}